

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O0

void CuTestRun(CuTest *tc)

{
  int iVar1;
  undefined1 local_d8 [8];
  jmp_buf buf;
  CuTest *tc_local;
  
  tc->jumpBuf = (jmp_buf *)local_d8;
  buf[0].__saved_mask.__val[0xf] = (unsigned_long)tc;
  iVar1 = _setjmp((__jmp_buf_tag *)local_d8);
  if (iVar1 == 0) {
    *(undefined4 *)(buf[0].__saved_mask.__val[0xf] + 0x18) = 1;
    (**(code **)(buf[0].__saved_mask.__val[0xf] + 8))(buf[0].__saved_mask.__val[0xf]);
  }
  *(undefined8 *)(buf[0].__saved_mask.__val[0xf] + 0x28) = 0;
  return;
}

Assistant:

void CuTestRun(CuTest* tc)
{
	jmp_buf buf;
	tc->jumpBuf = &buf;
	if (setjmp(buf) == 0)
	{
		tc->ran = 1;
		(tc->function)(tc);
	}
	tc->jumpBuf = 0;
}